

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

void __thiscall ArrayOps::evaluate(ArrayOps *this,SymTab *symTab)

{
  StringDescriptor *pSVar1;
  pointer pcVar2;
  ExprNode *pEVar3;
  long lVar4;
  int iVar5;
  TypeDescriptor *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StringDescriptor *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ArrayDescriptor *this_01;
  TypeDescriptor **__src;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> array;
  TypeDescriptor *newElement_1;
  TypeDescriptor *newElement;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> local_118;
  undefined1 local_100 [32];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [2];
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> local_90;
  StringDescriptor *local_78;
  string local_70;
  string local_50;
  
  ExprNode::token((Token *)local_100,this->_id);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_100._0_8_,(pointer)(local_100._0_8_ + local_100._8_8_));
  pTVar6 = SymTab::getValueFor(symTab,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_p != local_d0) {
    operator_delete(local_e0._M_p,local_d0[0]._M_allocated_capacity + 1);
  }
  pSVar1 = (StringDescriptor *)(local_100 + 0x10);
  if ((StringDescriptor *)local_100._0_8_ != pSVar1) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector
            (&local_118,&pTVar6->_array);
  pcVar2 = (this->_op)._name._M_dataplus._M_p;
  local_100._0_8_ = pSVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_100,pcVar2,pcVar2 + (this->_op)._name._M_string_length);
  iVar5 = std::__cxx11::string::compare(local_100);
  if ((StringDescriptor *)local_100._0_8_ != pSVar1) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  pEVar3 = this->_test;
  if (iVar5 == 0) {
    iVar5 = (*pEVar3->_vptr_ExprNode[1])(pEVar3,symTab);
    if (*(int *)(CONCAT44(extraout_var_00,iVar5) + 0x50) == 0) {
      this_00 = (StringDescriptor *)operator_new(0x60);
      iVar5 = (*this->_test->_vptr_ExprNode[1])(this->_test,symTab);
      NumberDescriptor::NumberDescriptor
                ((NumberDescriptor *)this_00,*(double *)(CONCAT44(extraout_var_02,iVar5) + 8));
      local_100._0_8_ = this_00;
      if (local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<TypeDescriptor*,std::allocator<TypeDescriptor*>>::
        _M_realloc_insert<TypeDescriptor*const&>
                  ((vector<TypeDescriptor*,std::allocator<TypeDescriptor*>> *)&local_118,
                   (iterator)
                   local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(TypeDescriptor **)local_100);
        goto LAB_00110b10;
      }
    }
    else {
      this_00 = (StringDescriptor *)operator_new(0x78);
      iVar5 = (*this->_test->_vptr_ExprNode[1])(this->_test,symTab);
      lVar4 = *(long *)(CONCAT44(extraout_var_01,iVar5) + 0x10);
      local_100._0_8_ = pSVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,lVar4,*(long *)(CONCAT44(extraout_var_01,iVar5) + 0x18) + lVar4
                );
      StringDescriptor::StringDescriptor(this_00,(string *)local_100);
      if ((StringDescriptor *)local_100._0_8_ != pSVar1) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      local_78 = this_00;
      if (local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<TypeDescriptor*,std::allocator<TypeDescriptor*>>::
        _M_realloc_insert<TypeDescriptor*const&>
                  ((vector<TypeDescriptor*,std::allocator<TypeDescriptor*>> *)&local_118,
                   (iterator)
                   local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(TypeDescriptor **)&local_78);
        goto LAB_00110b10;
      }
    }
    *local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
     super__Vector_impl_data._M_finish = &this_00->super_TypeDescriptor;
    local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  else if (pEVar3 == (ExprNode *)0x0) {
    local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  }
  else {
    iVar5 = (*pEVar3->_vptr_ExprNode[1])(pEVar3,symTab);
    __src = local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
            _M_impl.super__Vector_impl_data._M_start +
            (int)*(double *)(CONCAT44(extraout_var,iVar5) + 8);
    if (__src != local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish) {
      memmove(__src + -1,__src,
              (long)local_118.
                    super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src);
    }
    local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  }
LAB_00110b10:
  this_01 = (ArrayDescriptor *)operator_new(0x70);
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector(&local_90,&local_118);
  ArrayDescriptor::ArrayDescriptor(this_01,&local_90);
  if (local_90.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  ExprNode::token((Token *)local_100,this->_id);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_100._0_8_,(pointer)(local_100._0_8_ + local_100._8_8_));
  SymTab::setValueFor(symTab,&local_70,(TypeDescriptor *)this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_p != local_d0) {
    operator_delete(local_e0._M_p,local_d0[0]._M_allocated_capacity + 1);
  }
  if ((StringDescriptor *)local_100._0_8_ != pSVar1) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  if (local_118.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ArrayOps::evaluate(SymTab &symTab) {
    TypeDescriptor *value = symTab.getValueFor(_id->token().getName());
    std::vector<TypeDescriptor*>array = value->getArray();
    if(_op.getName() == "append"){
        if(_test->evaluate(symTab)->type() == TypeDescriptor::NUMBER){
            TypeDescriptor *newElement = new NumberDescriptor(_test->evaluate(symTab)->getNumber());
            array.push_back(newElement);
        }else{
            TypeDescriptor *newElement = new StringDescriptor(_test->evaluate(symTab)->getString());
            array.push_back(newElement);
        }

    }else{ // pop
        if(_test== nullptr) { //pop Last
            array.pop_back();
        }else{
            int index = _test->evaluate(symTab)->getNumber();
            array.erase(array.begin()+ index -1);
        }
    }
    TypeDescriptor *updatedArray = new ArrayDescriptor(array);
    symTab.setValueFor(_id->token().getName(),updatedArray);

}